

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O0

wchar_t borg_danger(wchar_t y,wchar_t x,wchar_t c,_Bool average,_Bool full_damage)

{
  chunk_conflict *c_00;
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict lVar3;
  wchar_t local_54;
  borg_kill *kill;
  loc l;
  wchar_t p;
  wchar_t i;
  _Bool full_damage_local;
  _Bool average_local;
  wchar_t c_local;
  wchar_t x_local;
  wchar_t y_local;
  
  l.x = 0;
  lVar3 = (loc_conflict)loc(x,y);
  _Var1 = square_in_bounds((chunk *)cave,lVar3);
  if (_Var1) {
    _Var1 = square_isvault((chunk *)cave,lVar3);
    c_00 = cave;
    if ((!_Var1) && (borg.trait[0x69] < 0x51)) {
      l.x = (uint)borg_fear_region[y / 0xb][x / 0xb] * c;
    }
    if ((borg.trait[0x69] == 100) && (299 < l.x)) {
      l.x = 300;
    }
    if (borg.time_this_panel < 0xc9) {
      lVar3 = (loc_conflict)loc(x,y);
      _Var1 = square_isvault((chunk *)c_00,lVar3);
      if (!_Var1) {
        l.x = (uint)borg_fear_monsters[y][x] * c + l.x;
      }
    }
    for (l.y = 1; l.y < borg_kills_nxt; l.y = l.y + 1) {
      if (borg_kills[l.y].r_idx != 0) {
        wVar2 = borg_danger_one_kill(y,x,c,l.y,average,true);
        l.x = wVar2 + l.x;
      }
    }
    if (l.x < 0x7d1) {
      local_54 = l.x;
    }
    else {
      local_54 = L'ߐ';
    }
    x_local = local_54;
  }
  else {
    x_local = L'ߐ';
  }
  return x_local;
}

Assistant:

int borg_danger(int y, int x, int c, bool average, bool full_damage)
{
    int i, p = 0;

    struct loc l = loc(x, y);
    if (!square_in_bounds(cave, l))
        return 2000;

    /* Base danger (from regional fear) but not within a vault.  Cheating the
     * floor grid */
    if (!square_isvault(cave, l) && borg.trait[BI_CDEPTH] <= 80) {
        p += borg_fear_region[y / 11][x / 11] * c;
    }

    /* Reduce regional fear on Depth 100 */
    if (borg.trait[BI_CDEPTH] == 100 && p >= 300)
        p = 300;

    /* Added danger (from a lot of monsters).
     * But do not add it if we have been sitting on
     * this panel for too long, or monster's in a vault.  The fear_monsters[][]
     * can induce some bouncy behavior.
     */
    if (borg.time_this_panel <= 200 && !square_isvault(cave, loc(x, y)))
        p += borg_fear_monsters[y][x] * c;

    full_damage = true;

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Collect danger from monster */
        p += borg_danger_one_kill(y, x, c, i, average, full_damage);
    }

    /* Return the danger */
    return (p > 2000 ? 2000 : p);
}